

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  u8 uVar4;
  int iVar7;
  undefined7 in_register_00000009;
  undefined8 uVar8;
  ulong uVar9;
  uint *puVar10;
  u8 *puVar11;
  long in_FS_OFFSET;
  undefined1 local_58 [20];
  ushort uStack_44;
  long local_38;
  u8 uVar5;
  u8 uVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar2 = *(uint *)pPage->aData;
    if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) != iFrom)
    {
      iVar7 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1237d,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      goto LAB_00141f2d;
    }
    *(Pgno *)pPage->aData = iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
  }
  else {
    iVar7 = 0;
    if (pPage->isInit == '\0') {
      iVar7 = btreeInitPage(pPage);
    }
    uVar9 = 0;
    bVar3 = false;
    if (iVar7 == 0) {
      uVar1 = pPage->nCell;
      if (uVar1 != 0) {
        uVar9 = 0;
        do {
          puVar10 = (uint *)(pPage->aData +
                            (CONCAT11(pPage->aCellIdx[uVar9 * 2],pPage->aCellIdx[uVar9 * 2 + 1]) &
                            pPage->maskPage));
          uVar4 = (u8)(iTo >> 0x18);
          uVar5 = (u8)(iTo >> 0x10);
          uVar6 = (u8)(iTo >> 8);
          if (eType == '\x03') {
            stack0xffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
            local_58._0_4_ = 0xaaaaaaaa;
            local_58._4_4_ = 0xaaaaaaaa;
            local_58._8_4_ = 0xaaaaaaaa;
            local_58._12_4_ = 0xaaaaaaaa;
            (*pPage->xParseCell)(pPage,(u8 *)puVar10,(CellInfo *)local_58);
            iVar7 = 0;
            if ((uint)uStack_44 < (uint)local_58._16_4_) {
              puVar11 = (u8 *)((long)puVar10 + ((ulong)stack0xffffffffffffffb8 >> 0x30));
              if (pPage->aData + pPage->pBt->usableSize < puVar11) {
                uVar8 = 0x12390;
                goto LAB_0014204c;
              }
              uVar2 = *(uint *)(puVar11 + -4);
              if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                  == iFrom) {
                puVar11[-4] = uVar4;
                puVar11[-3] = uVar5;
                puVar11[-2] = uVar6;
                puVar11[-1] = (u8)iTo;
                goto LAB_001420b5;
              }
            }
          }
          else if (pPage->aData + pPage->pBt->usableSize < puVar10 + 1) {
            uVar8 = 0x12399;
LAB_0014204c:
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
                        "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            iVar7 = 1;
          }
          else {
            uVar2 = *puVar10;
            iVar7 = 0;
            if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
                iFrom) {
              *(u8 *)puVar10 = uVar4;
              *(u8 *)((long)puVar10 + 1) = uVar5;
              *(u8 *)((long)puVar10 + 2) = uVar6;
              *(u8 *)((long)puVar10 + 3) = (u8)iTo;
LAB_001420b5:
              iVar7 = 2;
            }
          }
          if (iVar7 != 0) {
            if (iVar7 == 2) goto LAB_001420db;
            iVar7 = 0xb;
            bVar3 = false;
            goto LAB_00141ef7;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)uVar1 != uVar9);
        uVar9 = (ulong)(uint)uVar1;
      }
LAB_001420db:
      iVar7 = 0xb;
      bVar3 = true;
      if ((uint)uVar9 == (uint)uVar1) {
        if (eType == '\x05') {
          uVar2 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
          if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
              iFrom) {
            *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
                 iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
            goto LAB_00141ef7;
          }
        }
        bVar3 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x123a5,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      }
    }
LAB_00141ef7:
    if (!bVar3) goto LAB_00141f2d;
  }
  iVar7 = 0;
LAB_00141f2d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( pCell+4 > pPage->aData+pPage->pBt->usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }

    if( i==nCell ){
      if( eType!=PTRMAP_BTREE ||
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}